

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

string * __thiscall
flatbuffers::java::JavaGenerator::ConvertPrimitiveTypeToObjectWrapper_ObjectAPI
          (string *__return_storage_ptr__,JavaGenerator *this,string *type_name)

{
  bool bVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> aStack_18;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  __a = &aStack_18;
  bVar1 = std::operator==(type_name,"boolean");
  if (bVar1) {
    __s = "Boolean";
    __a = &local_11;
  }
  else {
    bVar1 = std::operator==(type_name,"byte");
    if (bVar1) {
      __s = "Byte";
      __a = &local_12;
    }
    else {
      bVar1 = std::operator==(type_name,"char");
      if (bVar1) {
        __s = "Character";
        __a = &local_13;
      }
      else {
        bVar1 = std::operator==(type_name,"short");
        if (bVar1) {
          __s = "Short";
          __a = &local_14;
        }
        else {
          bVar1 = std::operator==(type_name,"int");
          if (bVar1) {
            __s = "Integer";
            __a = &local_15;
          }
          else {
            bVar1 = std::operator==(type_name,"long");
            if (bVar1) {
              __s = "Long";
              __a = &local_16;
            }
            else {
              bVar1 = std::operator==(type_name,"float");
              if (bVar1) {
                __s = "Float";
                __a = &local_17;
              }
              else {
                bVar1 = std::operator==(type_name,"double");
                if (!bVar1) {
                  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)type_name)
                  ;
                  return __return_storage_ptr__;
                }
                __s = "Double";
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertPrimitiveTypeToObjectWrapper_ObjectAPI(
      const std::string &type_name) const {
    if (type_name == "boolean")
      return "Boolean";
    else if (type_name == "byte")
      return "Byte";
    else if (type_name == "char")
      return "Character";
    else if (type_name == "short")
      return "Short";
    else if (type_name == "int")
      return "Integer";
    else if (type_name == "long")
      return "Long";
    else if (type_name == "float")
      return "Float";
    else if (type_name == "double")
      return "Double";
    return type_name;
  }